

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O2

void game_loop_unix(int control)

{
  char *argument;
  uint uVar1;
  DESCRIPTOR_DATA *pDVar2;
  PC_DATA *pPVar3;
  byte bVar4;
  __time_t _Var5;
  bool bVar6;
  short sVar7;
  short sVar8;
  uint __i;
  int iVar9;
  long lVar10;
  __fd_mask *p_Var11;
  CHAR_DATA *pCVar12;
  ulong uVar13;
  int *piVar14;
  ulong uVar15;
  DESCRIPTOR_DATA **ppDVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  string_view fmt;
  string_view fmt_00;
  timeval now_time;
  timeval last_time;
  timeval stall_time;
  char *local_1b8;
  fd_set out_set;
  fd_set in_set;
  fd_set exc_set;
  
  signal(0xd,(__sighandler_t)0x1);
  gettimeofday((timeval *)&last_time,(__timezone_ptr_t)0x0);
  uVar20 = 1L << ((byte)control & 0x3f);
  do {
    _Var5 = last_time.tv_sec;
    if (merc_down != false) {
      current_time = last_time.tv_sec;
      return;
    }
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      in_set.fds_bits[lVar10] = 0;
    }
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      out_set.fds_bits[lVar10] = 0;
    }
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      exc_set.fds_bits[lVar10] = 0;
    }
    ppDVar16 = &descriptor_list;
    p_Var11 = in_set.fds_bits + control / 0x40;
    uVar15 = uVar20;
    iVar9 = control;
    while( true ) {
      *p_Var11 = *p_Var11 | uVar15;
      ppDVar16 = &((DESCRIPTOR_DATA *)ppDVar16)->next->next;
      if ((DESCRIPTOR_DATA *)ppDVar16 == (DESCRIPTOR_DATA *)0x0) break;
      sVar8 = ((DESCRIPTOR_DATA *)ppDVar16)->descriptor;
      if (iVar9 <= sVar8) {
        iVar9 = (int)sVar8;
      }
      sVar7 = sVar8 / 0x40;
      uVar15 = 1L << ((byte)sVar8 & 0x3f);
      in_set.fds_bits[sVar7] = in_set.fds_bits[sVar7] | uVar15;
      out_set.fds_bits[sVar7] = out_set.fds_bits[sVar7] | uVar15;
      p_Var11 = exc_set.fds_bits + sVar7;
    }
    current_time = last_time.tv_sec;
    iVar9 = select(iVar9 + 1,(fd_set *)&in_set,(fd_set *)&out_set,(fd_set *)&exc_set,
                   (timeval *)&game_loop_unix::null_time);
    if (iVar9 < 0) {
      piVar14 = __errno_location();
      now_time.tv_sec = (__time_t)strerror(*piVar14);
      fmt._M_str = "Game_loop: select poll: {}";
      fmt._M_len = 0x1a;
      CLogger::Error<char*>((CLogger *)&RS.field_0x140,fmt,(char **)&now_time);
      exit(0);
    }
    if ((in_set.fds_bits[control / 0x40] & uVar20) != 0) {
      init_descriptor(control);
    }
    ppDVar16 = &descriptor_list;
    while (pDVar2 = *ppDVar16, pDVar2 != (DESCRIPTOR_DATA *)0x0) {
      d_next = pDVar2->next;
      sVar8 = pDVar2->descriptor / 0x40;
      iVar9 = (int)pDVar2->descriptor % 0x40;
      ppDVar16 = &d_next;
      if (((ulong)exc_set.fds_bits[sVar8] >> ((ulong)(ushort)iVar9 & 0x3f) & 1) != 0) {
        uVar15 = ~(1L << ((byte)iVar9 & 0x3f));
        in_set.fds_bits[sVar8] = in_set.fds_bits[sVar8] & uVar15;
        out_set.fds_bits[sVar8] = out_set.fds_bits[sVar8] & uVar15;
        pCVar12 = pDVar2->character;
        if ((pCVar12 != (CHAR_DATA *)0x0) && (1 < pCVar12->level)) {
          save_char_obj(pCVar12);
        }
        pDVar2->outtop = 0;
        close_socket(pDVar2);
        ppDVar16 = &d_next;
      }
    }
    ppDVar16 = &descriptor_list;
    while (pDVar2 = *ppDVar16, pDVar2 != (DESCRIPTOR_DATA *)0x0) {
      d_next = pDVar2->next;
      pDVar2->fcommand = false;
      if (((ulong)in_set.fds_bits[pDVar2->descriptor / 0x40] >>
           ((ulong)(ushort)(pDVar2->descriptor % 0x40) & 0x3f) & 1) == 0) {
LAB_002d221f:
        pCVar12 = pDVar2->character;
        if ((pCVar12 == (CHAR_DATA *)0x0) ||
           (((sVar8 = pCVar12->wait, 0 < sVar8 && (pCVar12->wait = sVar8 + -1, sVar8 != 1)) ||
            (pCVar12->pcdata->pending != true)))) {
          read_from_buffer(pDVar2);
          ppDVar16 = &d_next;
          if (pDVar2->incomm[0] != '\0') {
            argument = pDVar2->incomm;
            pDVar2->fcommand = true;
            stop_idling(pDVar2->character);
            if (pDVar2->showstr_point == (char *)0x0) {
              if (pDVar2->pString == (char **)0x0) {
                if (pDVar2->connected == 0) {
                  pPVar3 = pDVar2->character->pcdata;
                  if ((pPVar3 == (PC_DATA *)0x0) || (pPVar3->entering_text != true)) {
                    bVar6 = run_olc_editor(pDVar2);
                    if (!bVar6) {
                      substitute_alias(pDVar2,argument);
                    }
                  }
                  else {
                    process_text(pDVar2->character,argument);
                  }
                }
                else {
                  nanny(pDVar2,argument);
                }
              }
              else {
                string_add(pDVar2->character,argument);
              }
            }
            else {
              show_string(pDVar2,argument);
            }
            *argument = '\0';
            ppDVar16 = &d_next;
          }
        }
        else {
          interpret(pCVar12,pCVar12->pcdata->queue[0]);
          pCVar12 = pDVar2->character;
          ppDVar16 = &d_next;
          if (pCVar12 != (CHAR_DATA *)0x0) {
            lVar19 = 0x1f6e;
            lVar10 = 1;
            while( true ) {
              pPVar3 = pCVar12->pcdata;
              if (pPVar3->write_next <= lVar10) break;
              strcpy((char *)((long)pPVar3 + lVar19 + -0x1200),
                     (char *)((long)&pPVar3->next + lVar19));
              lVar10 = lVar10 + 1;
              pCVar12 = pDVar2->character;
              lVar19 = lVar19 + 0x1200;
            }
            sVar8 = pPVar3->write_next + -1;
            pPVar3->write_next = sVar8;
            lVar10 = (long)sVar8;
            lVar19 = lVar10 * 0x1200 + 0xd6e;
            for (; pPVar3 = pDVar2->character->pcdata, lVar10 < 0x14; lVar10 = lVar10 + 1) {
              *(undefined1 *)((long)&pPVar3->next + lVar19) = 0;
              lVar19 = lVar19 + 0x1200;
            }
            ppDVar16 = &d_next;
            if (pPVar3->write_next == 0) {
              pPVar3->pending = false;
              ppDVar16 = &d_next;
            }
          }
        }
      }
      else {
        if (pDVar2->character != (CHAR_DATA *)0x0) {
          pDVar2->character->timer = 0;
        }
        bVar6 = read_from_descriptor(pDVar2);
        if (bVar6) goto LAB_002d221f;
        uVar1._0_2_ = pDVar2->descriptor;
        uVar1._2_2_ = pDVar2->connected;
        bVar4 = (byte)(undefined2)uVar1 & 0x3f;
        out_set.fds_bits
        [(short)((int)((uint)(ushort)((short)(undefined2)uVar1 >> 0xf) << 0x10 | uVar1 & 0xffff) /
                0x40)] =
             out_set.fds_bits
             [(short)((int)((uint)(ushort)((short)(undefined2)uVar1 >> 0xf) << 0x10 | uVar1 & 0xffff
                           ) / 0x40)] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
        pCVar12 = pDVar2->character;
        if ((pCVar12 != (CHAR_DATA *)0x0) && (1 < pCVar12->level)) {
          save_char_obj(pCVar12);
        }
        pDVar2->outtop = 0;
        close_socket(pDVar2);
        ppDVar16 = &d_next;
      }
    }
    update_handler();
    ppDVar16 = &descriptor_list;
    while (pDVar2 = *ppDVar16, pDVar2 != (DESCRIPTOR_DATA *)0x0) {
      d_next = pDVar2->next;
      if (((pDVar2->fcommand != false) || (ppDVar16 = &d_next, 0 < pDVar2->outtop)) &&
         (ppDVar16 = &d_next,
         ((ulong)out_set.fds_bits[pDVar2->descriptor / 0x40] >>
          ((ulong)(ushort)(pDVar2->descriptor % 0x40) & 0x3f) & 1) != 0)) {
        bVar6 = process_output(pDVar2,true);
        ppDVar16 = &d_next;
        if (!bVar6) {
          pCVar12 = pDVar2->character;
          if ((pCVar12 != (CHAR_DATA *)0x0) && (1 < pCVar12->level)) {
            save_char_obj(pCVar12);
          }
          pDVar2->outtop = 0;
          close_socket(pDVar2);
          ppDVar16 = &d_next;
        }
      }
    }
    gettimeofday((timeval *)&now_time,(__timezone_ptr_t)0x0);
    lVar10 = ((ulong)(uint)((int)last_time.tv_usec - (int)now_time.tv_usec) << 0x20) +
             0x3d09000000000;
    lVar18 = lVar10 >> 0x20;
    lVar19 = 0;
    if (0 < lVar18) {
      lVar19 = lVar18;
    }
    lVar10 = lVar10 >> 0x3f;
    lVar10 = (ulong)((lVar19 + lVar10) - lVar18) / 1000000 - lVar10;
    uVar15 = lVar10 * 1000000 + lVar18;
    lVar19 = uVar15 - 999999;
    if (uVar15 < 999999) {
      lVar19 = 0;
    }
    uVar13 = (lVar19 + 999999U) / 1000000;
    lVar18 = (long)((int)_Var5 - (int)now_time.tv_sec) + uVar13;
    lVar19 = uVar13 * -1000000 + uVar15;
    lVar17 = lVar18 - lVar10;
    if ((lVar17 != 0 && lVar10 <= lVar18) || ((lVar17 == 0 && (lVar19 != 0)))) {
      stall_time.tv_sec = lVar17;
      stall_time.tv_usec = lVar19;
      iVar9 = select(0,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&stall_time);
      if (iVar9 < 0) {
        piVar14 = __errno_location();
        local_1b8 = strerror(*piVar14);
        fmt_00._M_str = "Game_loop: select stall: {}";
        fmt_00._M_len = 0x1b;
        CLogger::Error<char*>((CLogger *)&RS.field_0x140,fmt_00,&local_1b8);
        exit(1);
      }
    }
    gettimeofday((timeval *)&last_time,(__timezone_ptr_t)0x0);
  } while( true );
}

Assistant:

void game_loop_unix(int control)
{
	static struct timeval null_time;
	struct timeval last_time;

	signal(SIGPIPE, SIG_IGN);
	gettimeofday(&last_time, nullptr);
	current_time = (time_t)last_time.tv_sec;

	/* Main loop */
	while (!merc_down)
	{
		fd_set in_set;
		fd_set out_set;
		fd_set exc_set;
		DESCRIPTOR_DATA *d;
		int maxdesc;

#ifdef MALLOC_DEBUG
		if (malloc_verify() != 1)
			abort();
#endif

		/*
		 * Poll all active descriptors.
		 */
		FD_ZERO(&in_set);
		FD_ZERO(&out_set);
		FD_ZERO(&exc_set);
		FD_SET(control, &in_set);

		maxdesc = control;

		for (d = descriptor_list; d; d = d->next)
		{
			maxdesc = std::max(maxdesc, (int)d->descriptor);
			FD_SET(d->descriptor, &in_set);
			FD_SET(d->descriptor, &out_set);
			FD_SET(d->descriptor, &exc_set);
		}

		if (select(maxdesc + 1, &in_set, &out_set, &exc_set, &null_time) < 0)
		{
			RS.Logger.Error("Game_loop: select poll: {}", std::strerror(errno));
			exit(0);
		}

		/*
		 * New connection?
		 */
		if (FD_ISSET(control, &in_set))
			init_descriptor(control);

		/*
		 * Kick out the freaky folks.
		 */
		for (d = descriptor_list; d != nullptr; d = d_next)
		{
			d_next = d->next;

			if (FD_ISSET(d->descriptor, &exc_set))
			{
				FD_CLR(d->descriptor, &in_set);
				FD_CLR(d->descriptor, &out_set);

				if (d->character && d->character->level > 1)
					save_char_obj(d->character);

				d->outtop = 0;
				close_socket(d);
			}
		}

		/*
		 * Process input.
		 */
		for (d = descriptor_list; d != nullptr; d = d_next)
		{
			d_next = d->next;
			d->fcommand= false;

			if (FD_ISSET(d->descriptor, &in_set))
			{
				if (d->character != nullptr)
					d->character->timer = 0;

				if (!read_from_descriptor(d))
				{
					FD_CLR(d->descriptor, &out_set);

					if (d->character != nullptr && d->character->level > 1)
						save_char_obj(d->character);

					d->outtop = 0;
					close_socket(d);
					continue;
				}
			}

			if (d->character != nullptr && d->character->wait > 0)
				--d->character->wait;

			if (d->character != nullptr && d->character->wait <= 0 && d->character->pcdata->pending)
			{
				int i = 0;
				interpret(d->character, d->character->pcdata->queue[0]);

				if (!d->character) // Cal: Silly Morglum.  But what if we just interpreted a "quit"?
					continue;	   // then d->character is null and we just crashed. :(

				for (i = 1; i < d->character->pcdata->write_next; i++)
				{
					strcpy(d->character->pcdata->queue[(i - 1)], d->character->pcdata->queue[i]);
				}

				d->character->pcdata->write_next--;

				for (i = d->character->pcdata->write_next; i < MAX_QUEUE; i++)
				{
					d->character->pcdata->queue[i][0] = '\0';
				}

				if (d->character->pcdata->write_next == 0)
					d->character->pcdata->pending= false;

				continue;
				/*
					d->character->pcdata->queue[d->character->pcdata->read_next][0] = '\0';
					d->character->pcdata->read_next++;

					if (d->character->pcdata->read_next > 19)
						d->character->pcdata->read_next = 0;
					if (d->character->pcdata->queue[d->character->pcdata->read_next][0] == '\0')
						d->character->pcdata->pending= false;
				*/
			}

			read_from_buffer(d);
			if (d->incomm[0] != '\0')
			{
				d->fcommand = true;
				stop_idling(d->character);

				/* OLC */
				if (d->showstr_point)
				{
					show_string(d, d->incomm);
				}
				else if (d->pString)
				{
					string_add(d->character, d->incomm);
				}
				else if (d->connected == CON_PLAYING && d->character->pcdata && d->character->pcdata->entering_text)
				{
					process_text(d->character, d->incomm);
				}
				else
				{
					switch (d->connected)
					{
						case CON_PLAYING:
							if (!run_olc_editor(d))
								substitute_alias(d, d->incomm);
							break;
						default:
							nanny(d, d->incomm);
							break;
					}
				}
				/*		if (d->showstr_point)
							show_string(d,d->incomm);
						else if ( d->connected == CON_PLAYING && d->character->pcdata &&
				   d->character->pcdata->entering_text ) process_text(d->character, d->incomm); else if ( d->connected
				   == CON_PLAYING ) substitute_alias( d, d->incomm ); else nanny( d, d->incomm );
				*/
				d->incomm[0] = '\0';
			}
		}

		/*
		 * Autonomous game motion.
		 */
		update_handler();

		/*
		 * Output.
		 */
		for (d = descriptor_list; d != nullptr; d = d_next)
		{
			d_next = d->next;

			if ((d->fcommand || d->outtop > 0) && FD_ISSET(d->descriptor, &out_set))
			{
				if (!process_output(d, true))
				{
					if (d->character != nullptr && d->character->level > 1)
						save_char_obj(d->character);

					d->outtop = 0;
					close_socket(d);
				}
			}
		}

		/*
		 * Synchronize to a clock.
		 * Sleep( last_time + 1/PULSE_PER_SECOND - now ).
		 * Careful here of signed versus unsigned arithmetic.
		 */
		{
			struct timeval now_time;
			long secDelta;
			long usecDelta;

			gettimeofday(&now_time, nullptr);

			usecDelta = ((int)last_time.tv_usec) - ((int)now_time.tv_usec) + 1000000 / PULSE_PER_SECOND;
			secDelta = ((int)last_time.tv_sec) - ((int)now_time.tv_sec);

			while (usecDelta < 0)
			{
				usecDelta += 1000000;
				secDelta -= 1;
			}

			while (usecDelta >= 1000000)
			{
				usecDelta -= 1000000;
				secDelta += 1;
			}

			if (secDelta > 0 || (secDelta == 0 && usecDelta > 0))
			{
				struct timeval stall_time;

				stall_time.tv_usec = usecDelta;
				stall_time.tv_sec = secDelta;

				if (select(0, nullptr, nullptr, nullptr, &stall_time) < 0)
				{
					RS.Logger.Error("Game_loop: select stall: {}", std::strerror(errno));
					exit(1);
				}
			}
		}

		gettimeofday(&last_time, nullptr);
		current_time = (time_t)last_time.tv_sec;
	}
}